

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qxdgdesktopportalfiledialog_p.cpp
# Opt level: O3

int __thiscall
QXdgDesktopPortalFileDialog::qt_metacall
          (QXdgDesktopPortalFileDialog *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_register_00000014;
  QXdgDesktopPortalFileDialog *_t;
  
  iVar1 = QPlatformFileDialogHelper::qt_metacall
                    ((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 == 0) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return iVar1;
      }
      if (iVar1 == 0) {
        gotResponse(this,*_a[1],(QVariantMap *)_a[2]);
      }
    }
    iVar1 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int QXdgDesktopPortalFileDialog::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QPlatformFileDialogHelper::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}